

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Workers.cpp
# Opt level: O0

void __thiscall
xmrig::Workers<xmrig::OclLaunchData>::start
          (Workers<xmrig::OclLaunchData> *this,
          vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *data)

{
  bool bVar1;
  __normal_iterator<xmrig::Thread<xmrig::OclLaunchData>_**,_std::vector<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>_>
  *__lhs;
  Thread<xmrig::OclLaunchData> *in_RDI;
  Thread<xmrig::OclLaunchData> *worker;
  iterator __end0_1;
  iterator __begin0_1;
  vector<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
  *__range1_1;
  OclLaunchData *item;
  const_iterator __end0;
  const_iterator __begin0;
  vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *__range1;
  OclLaunchData *in_stack_ffffffffffffff58;
  vector<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
  *in_stack_ffffffffffffff60;
  IBackend *in_stack_ffffffffffffff68;
  __normal_iterator<xmrig::Thread<xmrig::OclLaunchData>_**,_std::vector<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>_>
  *callback;
  Thread<xmrig::OclLaunchData> *in_stack_ffffffffffffff70;
  Hashrate *in_stack_ffffffffffffff78;
  Hashrate *in_stack_ffffffffffffff80;
  __normal_iterator<xmrig::Thread<xmrig::OclLaunchData>_**,_std::vector<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>_>
  local_58 [4];
  Hashrate *local_38;
  reference local_30;
  OclLaunchData *local_28;
  __normal_iterator<const_xmrig::OclLaunchData_*,_std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (OclLaunchData *)
       std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::begin
                 (in_stack_ffffffffffffff58);
  local_28 = (OclLaunchData *)
             std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::end
                       ((vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *)
                        in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_xmrig::OclLaunchData_*,_std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>_>
                        *)in_stack_ffffffffffffff60,
                       (__normal_iterator<const_xmrig::OclLaunchData_*,_std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar1) break;
    local_30 = __gnu_cxx::
               __normal_iterator<const_xmrig::OclLaunchData_*,_std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>_>
               ::operator*(local_20);
    in_stack_ffffffffffffff70 = in_RDI;
    in_stack_ffffffffffffff78 = (Hashrate *)operator_new(0x100);
    in_stack_ffffffffffffff80 = in_stack_ffffffffffffff78;
    std::
    vector<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
    ::size((vector<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
            *)in_RDI);
    Thread<xmrig::OclLaunchData>::Thread
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60
               ,in_stack_ffffffffffffff58);
    local_38 = in_stack_ffffffffffffff78;
    std::
    vector<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
    ::push_back(in_stack_ffffffffffffff60,(value_type *)in_stack_ffffffffffffff58);
    __gnu_cxx::
    __normal_iterator<const_xmrig::OclLaunchData_*,_std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>_>
    ::operator++(local_20);
  }
  __lhs = (__normal_iterator<xmrig::Thread<xmrig::OclLaunchData>_**,_std::vector<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>_>
           *)operator_new(0x20);
  callback = __lhs;
  std::
  vector<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
  ::size((vector<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
          *)in_RDI);
  Hashrate::Hashrate(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
  *(__normal_iterator<xmrig::Thread<xmrig::OclLaunchData>_**,_std::vector<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>_>
    **)(in_RDI->m_config).affinity = __lhs;
  OclLaunchData::backend();
  Nonce::touch(CPU);
  local_58[0]._M_current =
       (Thread<xmrig::OclLaunchData> **)
       std::
       vector<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
       ::begin((vector<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
                *)in_stack_ffffffffffffff58);
  std::
  vector<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
  ::end((vector<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
         *)in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (__lhs,(__normal_iterator<xmrig::Thread<xmrig::OclLaunchData>_**,_std::vector<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>_>
                              *)in_stack_ffffffffffffff58);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<xmrig::Thread<xmrig::OclLaunchData>_**,_std::vector<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>_>
    ::operator*(local_58);
    Thread<xmrig::OclLaunchData>::start(in_stack_ffffffffffffff70,(_func_void_void_ptr *)callback);
    __gnu_cxx::
    __normal_iterator<xmrig::Thread<xmrig::OclLaunchData>_**,_std::vector<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>_>
    ::operator++(local_58);
  }
  return;
}

Assistant:

void xmrig::Workers<T>::start(const std::vector<T> &data)
{
    for (const T &item : data) {
        m_workers.push_back(new Thread<T>(d_ptr->backend, m_workers.size(), item));
    }

    d_ptr->hashrate = new Hashrate(m_workers.size());
    Nonce::touch(T::backend());

    for (Thread<T> *worker : m_workers) {
        worker->start(Workers<T>::onReady);
    }
}